

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_blocked_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_sw_blocked_sse41_128_16
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  __m128i *palVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  __m128i *ptr;
  int iVar18;
  __m128i *ptr_00;
  __m128i *ptr_01;
  parasail_result_t *ppVar19;
  ulong uVar20;
  uint uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  int iVar26;
  long lVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  __m128i *palVar31;
  long lVar32;
  undefined2 uVar33;
  size_t size;
  __m128i extraout_XMM0;
  __m128i alVar34;
  undefined1 auVar35 [16];
  short sVar36;
  short sVar38;
  undefined1 in_XMM2 [16];
  undefined1 auVar37 [16];
  short sVar39;
  short sVar40;
  short sVar41;
  short sVar42;
  short sVar43;
  short sVar44;
  short sVar45;
  short sVar46;
  short sVar47;
  short sVar48;
  ushort uVar49;
  ushort uVar51;
  ushort uVar52;
  ushort uVar53;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  undefined1 auVar50 [16];
  ushort uVar57;
  ushort uVar58;
  short sVar59;
  short sVar62;
  short sVar63;
  short sVar64;
  short sVar65;
  short sVar66;
  short sVar67;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar72;
  short sVar73;
  undefined1 auVar60 [16];
  short sVar74;
  undefined1 auVar61 [16];
  short sVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  short sVar78;
  undefined1 auVar79 [16];
  __m128i_16_t t;
  longlong local_88;
  longlong lStack_80;
  size_t local_78;
  char *local_70;
  parasail_result_t *local_68;
  __m128i *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar21 = s1Len + 0xe;
  if (-1 < (int)(s1Len + 7U)) {
    uVar21 = s1Len + 7U;
  }
  uVar25 = (int)uVar21 >> 3;
  local_70 = s2;
  ptr_00 = parasail_memalign___m128i(0x10,(long)(int)((uVar21 & 0xfffffff8) * 3));
  size = (size_t)(int)uVar25;
  local_60 = parasail_memalign___m128i(0x10,size);
  ptr_01 = parasail_memalign___m128i(0x10,size);
  local_48 = ZEXT416((uint)open);
  local_58 = ZEXT416((uint)gap);
  ppVar19 = parasail_result_new();
  ptr = local_60;
  iVar26 = 0;
  uVar21 = 1;
  if (1 < (int)uVar25) {
    uVar21 = uVar25;
  }
  lVar24 = 0;
  alVar34 = extraout_XMM0;
  do {
    if (0 < s1Len) {
      lVar24 = (long)(int)lVar24;
      lVar27 = 0;
      uVar28 = 0;
      do {
        lVar30 = 0;
        lVar32 = lVar27;
        do {
          if (lVar32 < s1Len) {
            uVar33 = (undefined2)
                     matrix->matrix[(long)matrix->mapper[(byte)s1[lVar32]] * (long)matrix->size];
          }
          else {
            uVar33 = 0;
          }
          *(undefined2 *)((long)&local_88 + lVar30) = uVar33;
          lVar32 = lVar32 + 1;
          lVar30 = lVar30 + 2;
        } while (lVar30 != 0x10);
        alVar34[1] = lStack_80;
        alVar34[0] = local_88;
        ptr_00[lVar24] = alVar34;
        lVar24 = lVar24 + 1;
        uVar28 = uVar28 + 1;
        lVar27 = lVar27 + 8;
      } while (uVar28 != uVar21);
    }
    iVar26 = iVar26 + 1;
  } while (iVar26 != 0x18);
  if (0 < s1Len) {
    uVar20 = 1;
    if (1 < (int)uVar25) {
      uVar20 = (ulong)uVar25;
    }
    uVar23 = 0;
    alVar34[0] = 0;
    alVar34[1] = 0;
    do {
      lVar24 = 0;
      do {
        *(short *)((long)&local_88 + lVar24 * 2) = -(short)open;
        lVar24 = lVar24 + 1;
      } while (lVar24 != 8);
      local_60[uVar23] = (__m128i)0x0;
      ptr_01[uVar23][0] = local_88;
      ptr_01[uVar23][1] = lStack_80;
      uVar23 = uVar23 + 1;
    } while (uVar23 != uVar20);
  }
  if (s2Len < 1) {
    auVar35 = (undefined1  [16])0x0;
  }
  else {
    auVar35 = pshuflw((undefined1  [16])alVar34,local_48,0);
    auVar37 = pshuflw(in_XMM2,local_58,0);
    sVar36 = auVar37._0_2_;
    sVar39 = auVar35._0_2_;
    sVar38 = auVar37._2_2_;
    sVar40 = auVar35._2_2_;
    uVar20 = 1;
    if (1 < (int)uVar25) {
      uVar20 = (ulong)uVar25;
    }
    uVar23 = 0;
    auVar35 = (undefined1  [16])0x0;
    do {
      if (0 < s1Len) {
        iVar26 = matrix->mapper[(byte)local_70[uVar23]];
        auVar50 = (undefined1  [16])0x0;
        uVar29 = 0;
        auVar37 = auVar35;
        uVar58 = 0xc000;
        do {
          alVar34 = local_60[uVar29];
          palVar1 = ptr_01 + uVar29;
          sVar41 = (short)(*palVar1)[0];
          sVar42 = *(short *)((long)*palVar1 + 2);
          sVar43 = *(short *)((long)*palVar1 + 4);
          sVar44 = *(short *)((long)*palVar1 + 6);
          sVar45 = (short)(*palVar1)[1];
          sVar46 = *(short *)((long)*palVar1 + 10);
          sVar47 = *(short *)((long)*palVar1 + 0xc);
          sVar48 = *(short *)((long)*palVar1 + 0xe);
          auVar60._0_8_ = alVar34[0] << 0x10;
          auVar60._8_8_ = alVar34[1] << 0x10 | alVar34[0] >> 0x30;
          auVar60 = auVar60 | auVar50;
          palVar1 = ptr_00 + (long)iVar26 * size + uVar29;
          sVar59 = auVar60._0_2_ + (short)(*palVar1)[0];
          sVar62 = auVar60._2_2_ + *(short *)((long)*palVar1 + 2);
          sVar64 = auVar60._4_2_ + *(short *)((long)*palVar1 + 4);
          sVar66 = auVar60._6_2_ + *(short *)((long)*palVar1 + 6);
          sVar68 = auVar60._8_2_ + (short)(*palVar1)[1];
          sVar70 = auVar60._10_2_ + *(short *)((long)*palVar1 + 10);
          sVar72 = auVar60._12_2_ + *(short *)((long)*palVar1 + 0xc);
          sVar74 = auVar60._14_2_ + *(short *)((long)*palVar1 + 0xe);
          sVar63 = (ushort)(-1 < sVar41) * sVar41;
          sVar78 = (ushort)(-1 < sVar42) * sVar42;
          sVar69 = (ushort)(-1 < sVar43) * sVar43;
          sVar71 = (ushort)(-1 < sVar44) * sVar44;
          sVar73 = (ushort)(-1 < sVar45) * sVar45;
          sVar67 = (ushort)(-1 < sVar46) * sVar46;
          sVar75 = (ushort)(-1 < sVar47) * sVar47;
          sVar65 = (ushort)(-1 < sVar48) * sVar48;
          uVar49 = (ushort)(sVar63 < sVar59) * sVar59 | (ushort)(sVar63 >= sVar59) * sVar63;
          uVar51 = (ushort)(sVar78 < sVar62) * sVar62 | (ushort)(sVar78 >= sVar62) * sVar78;
          uVar52 = (ushort)(sVar69 < sVar64) * sVar64 | (ushort)(sVar69 >= sVar64) * sVar69;
          uVar53 = (ushort)(sVar71 < sVar66) * sVar66 | (ushort)(sVar71 >= sVar66) * sVar71;
          uVar54 = (ushort)(sVar73 < sVar68) * sVar68 | (ushort)(sVar73 >= sVar68) * sVar73;
          uVar55 = (ushort)(sVar67 < sVar70) * sVar70 | (ushort)(sVar67 >= sVar70) * sVar67;
          uVar56 = (ushort)(sVar75 < sVar72) * sVar72 | (ushort)(sVar75 >= sVar72) * sVar75;
          uVar57 = (ushort)(sVar65 < sVar74) * sVar74 | (ushort)(sVar65 >= sVar74) * sVar65;
          auVar50._0_2_ = uVar58 - sVar39;
          auVar50._2_2_ = uVar49 - sVar40;
          auVar50._4_2_ = uVar51 - sVar39;
          auVar50._6_2_ = uVar52 - sVar40;
          auVar50._8_2_ = uVar53 - sVar39;
          auVar50._10_2_ = uVar54 - sVar40;
          auVar50._12_2_ = uVar55 - sVar39;
          auVar50._14_2_ = uVar56 - sVar40;
          auVar76._0_2_ = -(ushort)(0 < auVar50._0_2_);
          auVar76._2_2_ = -(ushort)(0 < auVar50._2_2_);
          auVar76._4_2_ = -(ushort)(0 < auVar50._4_2_);
          auVar76._6_2_ = -(ushort)(0 < auVar50._6_2_);
          auVar76._8_2_ = -(ushort)(0 < auVar50._8_2_);
          auVar76._10_2_ = -(ushort)(0 < auVar50._10_2_);
          auVar76._12_2_ = -(ushort)(0 < auVar50._12_2_);
          auVar76._14_2_ = -(ushort)(0 < auVar50._14_2_);
          bVar16 = (auVar76 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar17 = (auVar76 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar15 = (auVar76 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar14 = (auVar76 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar13 = (auVar76 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar12 = (auVar76 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar11 = (auVar76 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar10 = (auVar76 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar9 = (auVar76 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar8 = (auVar76 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar7 = (auVar76 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar6 = (auVar76 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar5 = (auVar76 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar4 = (auVar76 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0;
          bVar3 = (auVar76._14_2_ >> 7 & 1) != 0;
          bVar2 = (auVar76._14_2_ & 0x8000) != 0;
          uVar58 = uVar57;
          if (((((((((((((((bVar16 || bVar17) || bVar15) || bVar14) || bVar13) || bVar12) || bVar11)
                     || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar5) || bVar4) || bVar3
              ) || bVar2) {
            auVar35 = auVar50;
            auVar77 = auVar50;
            if (((((((((((((((bVar16 || bVar17) || bVar15) || bVar14) || bVar13) || bVar12) ||
                        bVar11) || bVar10) || bVar9) || bVar8) || bVar7) || bVar6) || bVar5) ||
                 bVar4) || bVar3) || bVar2) {
              do {
                sVar78 = -sVar36;
                auVar61._2_2_ = auVar50._0_2_ - sVar38;
                auVar61._0_2_ = sVar78;
                auVar61._4_2_ = auVar50._2_2_ - sVar36;
                auVar61._6_2_ = auVar50._4_2_ - sVar38;
                auVar61._8_2_ = auVar50._6_2_ - sVar36;
                auVar61._10_2_ = auVar50._8_2_ - sVar38;
                auVar61._12_2_ = auVar50._10_2_ - sVar36;
                auVar61._14_2_ = auVar50._12_2_ - sVar38;
                sVar63 = auVar35._0_2_;
                auVar77._0_2_ =
                     (ushort)(sVar63 < sVar78) * sVar78 | (ushort)(sVar63 >= sVar78) * sVar63;
                sVar78 = auVar35._2_2_;
                auVar77._2_2_ =
                     (ushort)(sVar78 < auVar61._2_2_) * auVar61._2_2_ |
                     (ushort)(sVar78 >= auVar61._2_2_) * sVar78;
                sVar78 = auVar35._4_2_;
                auVar77._4_2_ =
                     (ushort)(sVar78 < auVar61._4_2_) * auVar61._4_2_ |
                     (ushort)(sVar78 >= auVar61._4_2_) * sVar78;
                sVar78 = auVar35._6_2_;
                auVar77._6_2_ =
                     (ushort)(sVar78 < auVar61._6_2_) * auVar61._6_2_ |
                     (ushort)(sVar78 >= auVar61._6_2_) * sVar78;
                sVar78 = auVar35._8_2_;
                auVar77._8_2_ =
                     (ushort)(sVar78 < auVar61._8_2_) * auVar61._8_2_ |
                     (ushort)(sVar78 >= auVar61._8_2_) * sVar78;
                sVar78 = auVar35._10_2_;
                auVar77._10_2_ =
                     (ushort)(sVar78 < auVar61._10_2_) * auVar61._10_2_ |
                     (ushort)(sVar78 >= auVar61._10_2_) * sVar78;
                sVar78 = auVar35._12_2_;
                sVar63 = auVar35._14_2_;
                auVar77._12_2_ =
                     (ushort)(sVar78 < auVar61._12_2_) * auVar61._12_2_ |
                     (ushort)(sVar78 >= auVar61._12_2_) * sVar78;
                auVar77._14_2_ =
                     (ushort)(sVar63 < auVar61._14_2_) * auVar61._14_2_ |
                     (ushort)(sVar63 >= auVar61._14_2_) * sVar63;
                auVar79._0_2_ = -(ushort)(sVar36 < 0);
                auVar79._2_2_ = -(ushort)(0 < auVar61._2_2_);
                auVar79._4_2_ = -(ushort)(0 < auVar61._4_2_);
                auVar79._6_2_ = -(ushort)(0 < auVar61._6_2_);
                auVar79._8_2_ = -(ushort)(0 < auVar61._8_2_);
                auVar79._10_2_ = -(ushort)(0 < auVar61._10_2_);
                auVar79._12_2_ = -(ushort)(0 < auVar61._12_2_);
                auVar79._14_2_ = -(ushort)(0 < auVar61._14_2_);
                auVar50 = auVar61;
                auVar35 = auVar77;
              } while ((((((((((((((((auVar79 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                    || (auVar79 >> 0xf & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                   (auVar79 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar79 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar79 >> 0x27 & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar79 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar79 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar79 >> 0x3f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar79 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar79 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar79 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar79 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar79 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar79 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar79._14_2_ >> 7 & 1) != 0) || (auVar79._14_2_ & 0x8000) != 0);
            }
            sVar78 = auVar77._0_2_;
            uVar49 = (ushort)((short)uVar49 < sVar78) * sVar78 | ((short)uVar49 >= sVar78) * uVar49;
            sVar78 = auVar77._2_2_;
            uVar51 = (ushort)((short)uVar51 < sVar78) * sVar78 | ((short)uVar51 >= sVar78) * uVar51;
            sVar78 = auVar77._4_2_;
            uVar52 = (ushort)((short)uVar52 < sVar78) * sVar78 | ((short)uVar52 >= sVar78) * uVar52;
            sVar78 = auVar77._6_2_;
            uVar53 = (ushort)((short)uVar53 < sVar78) * sVar78 | ((short)uVar53 >= sVar78) * uVar53;
            sVar78 = auVar77._8_2_;
            uVar54 = (ushort)((short)uVar54 < sVar78) * sVar78 | ((short)uVar54 >= sVar78) * uVar54;
            sVar78 = auVar77._10_2_;
            uVar55 = (ushort)((short)uVar55 < sVar78) * sVar78 | ((short)uVar55 >= sVar78) * uVar55;
            sVar78 = auVar77._12_2_;
            uVar56 = (ushort)((short)uVar56 < sVar78) * sVar78 | ((short)uVar56 >= sVar78) * uVar56;
            sVar78 = auVar77._14_2_;
            uVar57 = (ushort)((short)uVar57 < sVar78) * sVar78 | ((short)uVar57 >= sVar78) * uVar57;
            sVar78 = sVar78 + (sVar40 - sVar38);
            uVar58 = (sVar78 < (short)uVar57) * uVar57 | (ushort)(sVar78 >= (short)uVar57) * sVar78;
          }
          palVar1 = local_60 + uVar29;
          palVar31 = ptr_01 + uVar29;
          auVar50 = (undefined1  [16])alVar34 >> 0x70;
          *(ushort *)*palVar1 = uVar49;
          *(ushort *)((long)*palVar1 + 2) = uVar51;
          *(ushort *)((long)*palVar1 + 4) = uVar52;
          *(ushort *)((long)*palVar1 + 6) = uVar53;
          *(ushort *)(*palVar1 + 1) = uVar54;
          *(ushort *)((long)*palVar1 + 10) = uVar55;
          *(ushort *)((long)*palVar1 + 0xc) = uVar56;
          *(ushort *)((long)*palVar1 + 0xe) = uVar57;
          sVar78 = auVar37._0_2_;
          auVar35._0_2_ =
               (sVar78 < (short)uVar49) * uVar49 | (ushort)(sVar78 >= (short)uVar49) * sVar78;
          sVar78 = auVar37._2_2_;
          auVar35._2_2_ =
               (sVar78 < (short)uVar51) * uVar51 | (ushort)(sVar78 >= (short)uVar51) * sVar78;
          sVar78 = auVar37._4_2_;
          auVar35._4_2_ =
               (sVar78 < (short)uVar52) * uVar52 | (ushort)(sVar78 >= (short)uVar52) * sVar78;
          sVar78 = auVar37._6_2_;
          auVar35._6_2_ =
               (sVar78 < (short)uVar53) * uVar53 | (ushort)(sVar78 >= (short)uVar53) * sVar78;
          sVar78 = auVar37._8_2_;
          auVar35._8_2_ =
               (sVar78 < (short)uVar54) * uVar54 | (ushort)(sVar78 >= (short)uVar54) * sVar78;
          sVar78 = auVar37._10_2_;
          auVar35._10_2_ =
               (sVar78 < (short)uVar55) * uVar55 | (ushort)(sVar78 >= (short)uVar55) * sVar78;
          sVar78 = auVar37._12_2_;
          sVar63 = auVar37._14_2_;
          auVar35._12_2_ =
               (sVar78 < (short)uVar56) * uVar56 | (ushort)(sVar78 >= (short)uVar56) * sVar78;
          auVar35._14_2_ =
               (sVar63 < (short)uVar57) * uVar57 | (ushort)(sVar63 >= (short)uVar57) * sVar63;
          sVar78 = uVar49 - sVar39;
          sVar63 = uVar51 - sVar40;
          sVar65 = uVar52 - sVar39;
          sVar67 = uVar53 - sVar40;
          sVar69 = uVar54 - sVar39;
          sVar71 = uVar55 - sVar40;
          sVar73 = uVar56 - sVar39;
          sVar75 = uVar57 - sVar40;
          sVar41 = sVar41 - sVar36;
          sVar42 = sVar42 - sVar38;
          sVar43 = sVar43 - sVar36;
          sVar44 = sVar44 - sVar38;
          sVar45 = sVar45 - sVar36;
          sVar46 = sVar46 - sVar38;
          sVar47 = sVar47 - sVar36;
          sVar48 = sVar48 - sVar38;
          *(ushort *)*palVar31 =
               (ushort)(sVar41 < sVar78) * sVar78 | (ushort)(sVar41 >= sVar78) * sVar41;
          *(ushort *)((long)*palVar31 + 2) =
               (ushort)(sVar42 < sVar63) * sVar63 | (ushort)(sVar42 >= sVar63) * sVar42;
          *(ushort *)((long)*palVar31 + 4) =
               (ushort)(sVar43 < sVar65) * sVar65 | (ushort)(sVar43 >= sVar65) * sVar43;
          *(ushort *)((long)*palVar31 + 6) =
               (ushort)(sVar44 < sVar67) * sVar67 | (ushort)(sVar44 >= sVar67) * sVar44;
          *(ushort *)(*palVar31 + 1) =
               (ushort)(sVar45 < sVar69) * sVar69 | (ushort)(sVar45 >= sVar69) * sVar45;
          *(ushort *)((long)*palVar31 + 10) =
               (ushort)(sVar46 < sVar71) * sVar71 | (ushort)(sVar46 >= sVar71) * sVar46;
          *(ushort *)((long)*palVar31 + 0xc) =
               (ushort)(sVar47 < sVar73) * sVar73 | (ushort)(sVar47 >= sVar73) * sVar47;
          *(ushort *)((long)*palVar31 + 0xe) =
               (ushort)(sVar48 < sVar75) * sVar75 | (ushort)(sVar48 >= sVar75) * sVar48;
          uVar29 = uVar29 + 1;
          auVar37 = auVar35;
        } while (uVar29 != uVar20);
      }
      uVar23 = uVar23 + 1;
    } while (uVar23 != (uint)s2Len);
  }
  iVar22 = -0x4000;
  iVar26 = 8;
  do {
    uVar20 = auVar35._0_8_;
    lVar24 = auVar35._8_8_;
    iVar18 = (int)auVar35._14_2_;
    if (auVar35._14_2_ < iVar22) {
      iVar18 = iVar22;
    }
    iVar22 = iVar18;
    auVar35._0_8_ = uVar20 << 0x10;
    auVar35._8_8_ = lVar24 << 0x10 | uVar20 >> 0x30;
    iVar26 = iVar26 + -1;
  } while (iVar26 != 0);
  ppVar19->score = iVar22;
  ppVar19->flag = ppVar19->flag | 0x8202004;
  local_78 = size;
  local_68 = ppVar19;
  parasail_free(ptr_01);
  parasail_free(ptr);
  parasail_free(ptr_00);
  return ppVar19;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    const int32_t n = 24; /* number of amino acids in table */
    const int32_t segWidth = 8; /* number of values in vector unit */
    const int32_t segLen = (s1Len + segWidth - 1) / segWidth;
    __m128i* const restrict vProfile = parasail_memalign___m128i(16, n * segLen);
    __m128i* restrict pvH = parasail_memalign___m128i(16, segLen);
    __m128i* const restrict pvE = parasail_memalign___m128i(16, segLen);
    int score = NEG_INF_16;
    __m128i vGapO = _mm_set1_epi16(open);
    __m128i vGapE = _mm_set1_epi16(gap);
    __m128i vZero = _mm_setzero_si128();
    __m128i vNegInf = _mm_set1_epi16(NEG_INF_16);
    __m128i vMaxH = vZero;
#ifdef PARASAIL_TABLE
    parasail_result_t *result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    parasail_result_t *result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
    const int32_t offset = segLen - 1;
    const int32_t position = s1Len % segWidth;
#else
    parasail_result_t *result = parasail_result_new();
#endif
#endif

    /* Generate query profile.
     * Rearrange query sequence & calculate the weight of match/mismatch.
     * Don't alias. */
    {
        int32_t index = 0;
        for (k=0; k<n; ++k) {
            for (i=0; i<segLen; ++i) {
                __m128i_16_t t;
                j = i*segWidth;
                for (segNum=0; segNum<segWidth; ++segNum) {
                    t.v[segNum] = j >= s1Len ? 0 : matrix->matrix[matrix->size*matrix->mapper[(unsigned char)s1[j]]];
                    j += 1;
                }
                _mm_store_si128(&vProfile[index], t.m);
                ++index;
            }
        }
    }

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                h.v[segNum] = 0;
                e.v[segNum] = -open;
            }
            _mm_store_si128(&pvH[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vX = vZero;
        __m128i vF = vNegInf;
        const __m128i* pvP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;
        for (i=0; i<segLen; ++i) {
            __m128i vP;
            __m128i vH;
            __m128i vE;
            __m128i vT1;

            vH = _mm_load_si128(pvH + i);
            vE = _mm_load_si128(pvE + i);

            vT1 = _mm_srli_si128(vH, 14); /* rshift 3 */
            vH = _mm_slli_si128(vH, 2); /* lshift 1 */
            vH = _mm_or_si128(vH, vX);
            vX = vT1;

            vP = _mm_load_si128(pvP + i);
            vH = _mm_add_epi16(vH, vP);
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vZero);

            vF = _mm_srli_si128(vF, 14);
            vF = _mm_or_si128(vF, _mm_slli_si128(vH, 2));
            vF = _mm_sub_epi16(vF, vGapO);
            if (_mm_movemask_epi8(_mm_cmpgt_epi16(vF, vZero))) {
                __m128i vT2 = vF;
                while (_mm_movemask_epi8(_mm_cmpgt_epi16(vT2, vZero))) {
                    vT2 = _mm_slli_si128(vT2, 2);
                    vT2 = _mm_sub_epi16(vT2, vGapE);
                    vF = _mm_max_epi16(vF, vT2);
                }
                vH = _mm_max_epi16(vH, vF);
                vF = _mm_add_epi16(vF, vGapO);
                vF = _mm_sub_epi16(vF, vGapE);
                vF = _mm_max_epi16(vH, vF);
            }
            else {
                vF = vH;
            }

            _mm_store_si128(pvH + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segWidth, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vMaxH, vH);

            vH = _mm_sub_epi16(vH, vGapO);
            vE = _mm_sub_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH + i);
        arr_store_col(result->rowcols->score_col, vH, i, segWidth);
    }
#endif

    /* max in vec */
    for (j=0; j<segWidth; ++j) {
        int16_t value = (int16_t) _mm_extract_epi16(vMaxH, 7);
        if (value > score) {
            score = value;
        }
        vMaxH = _mm_slli_si128(vMaxH, 2);
    }

    result->score = score;
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_BLOCKED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    parasail_free(pvE);
    parasail_free(pvH);
    parasail_free(vProfile);

    return result;
}